

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cia.c
# Opt level: O0

void write_struct_with_padding(FILE *fd,void *data,size_t sz)

{
  undefined1 local_68 [8];
  uint8_t zero [64];
  size_t pad_size;
  size_t sz_local;
  void *data_local;
  FILE *fd_local;
  
  zero._56_8_ = (sz + 0x3f & 0xffffffffffffffc0) - sz;
  fwrite(data,sz,1,(FILE *)fd);
  if (zero._56_8_ != 0) {
    memset(local_68,0,zero._56_8_);
    fwrite(local_68,1,zero._56_8_,(FILE *)fd);
  }
  return;
}

Assistant:

static void write_struct_with_padding(FILE *fd, const void *data, size_t sz) {
    size_t pad_size = (size_t)(((sz + 0x3F) & ~0x3FULL) - sz);
    fwrite(data, sz, 1, fd);
    if (pad_size > 0) {
        uint8_t zero[0x40];
        memset(zero, 0, pad_size);
        fwrite(zero, 1, pad_size, fd);
    }
}